

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void http_write_log(http_s *h)

{
  long lVar1;
  long lVar2;
  FIOBJ dest;
  uint64_t key_hash;
  FIOBJ FVar3;
  fiobj_object_vtable_s *pfVar4;
  ulong num;
  char *data;
  size_t sStack_80;
  fio_str_info_s buff;
  timespec end;
  fio_lock_i ret;
  undefined7 uStack_47;
  size_t sStack_40;
  char *local_38;
  
  dest = fiobj_str_buf(0x80);
  FVar3 = (h->private_data).out_headers;
  key_hash = fiobj_obj2hash(HTTP_HEADER_CONTENT_LENGTH);
  FVar3 = fiobj_hash_get2(FVar3,key_hash);
  if ((FVar3 & 1) == 0) {
    if (FVar3 == 0 || (~(uint)FVar3 & 6) == 0) {
      num = (ulong)(FVar3 == 0x16);
    }
    else {
      pfVar4 = fiobj_type_vtable(FVar3);
      num = (*pfVar4->to_i)(FVar3);
    }
  }
  else {
    num = FVar3 >> 1 & 0x3fffffffffffffff | (long)FVar3 >> 0x3f & 0xc000000000000000U;
  }
  clock_gettime(0,(timespec *)&end);
  lVar1 = (h->received_at).tv_sec;
  lVar2 = (h->received_at).tv_nsec;
  fio_peer_addr(&buff,*(intptr_t *)((h->private_data).flag + 0x30));
  fiobj_str_write(dest,buff.data,buff.len);
  fiobj_obj2cstr(&buff,dest);
  if (buff.len == 0) {
    builtin_strncpy(buff.data,"[unknown]",9);
    buff.len = 9;
  }
  builtin_strncpy(buff.data + buff.len," - - [",6);
  buff.len = buff.len + 6;
  fiobj_str_resize(dest,buff.len);
  fio_lock(&date_lock);
  FVar3 = current_date;
  fiobj_dup(current_date);
  ret = date_lock;
  LOCK();
  date_lock = '\0';
  UNLOCK();
  fiobj_str_concat(dest,current_date);
  fiobj_free(FVar3);
  fiobj_str_write(dest,"] \"",3);
  fiobj_str_concat(dest,h->method);
  fiobj_str_write(dest," ",1);
  fiobj_str_concat(dest,h->path);
  fiobj_str_write(dest," ",1);
  fiobj_str_concat(dest,h->version);
  fiobj_str_write(dest,"\" ",2);
  if ((long)num < 1) {
    FVar3 = fiobj_num_tmp(h->status);
    fiobj_str_concat(dest,FVar3);
    data = " -- ";
    sStack_80 = 4;
  }
  else {
    fiobj_str_write_i(dest,h->status);
    fiobj_str_write(dest," ",1);
    fiobj_str_write_i(dest,num);
    data = "b ";
    sStack_80 = 2;
  }
  fiobj_str_write(dest,data,sStack_80);
  fiobj_str_write_i(dest,(end.tv_sec - lVar1) * 1000 + (end.tv_nsec - lVar2) / 1000000);
  fiobj_str_write(dest,"ms\r\n",4);
  fiobj_obj2cstr((fio_str_info_s *)&ret,dest);
  buff.data = local_38;
  buff.capa = CONCAT71(uStack_47,ret);
  buff.len = sStack_40;
  fwrite(local_38,1,sStack_40,_stderr);
  fiobj_free(dest);
  return;
}

Assistant:

void http_write_log(http_s *h) {
  FIOBJ l = fiobj_str_buf(128);

  intptr_t bytes_sent = fiobj_obj2num(fiobj_hash_get2(
      h->private_data.out_headers, fiobj_obj2hash(HTTP_HEADER_CONTENT_LENGTH)));

  struct timespec start, end;
  clock_gettime(CLOCK_REALTIME, &end);
  start = h->received_at;

  {
    // TODO Guess IP address from headers (forwarded) where possible
    fio_str_info_s peer = fio_peer_addr(http2protocol(h)->uuid);
    fiobj_str_write(l, peer.data, peer.len);
  }
  fio_str_info_s buff = fiobj_obj2cstr(l);

  if (buff.len == 0) {
    memcpy(buff.data, "[unknown]", 9);
    buff.len = 9;
  }
  memcpy(buff.data + buff.len, " - - [", 6);
  buff.len += 6;
  fiobj_str_resize(l, buff.len);
  {
    FIOBJ date;
    fio_lock(&date_lock);
    date = fiobj_dup(current_date);
    fio_unlock(&date_lock);
    fiobj_str_join(l, current_date);
    fiobj_free(date);
  }
  fiobj_str_write(l, "] \"", 3);
  fiobj_str_join(l, h->method);
  fiobj_str_write(l, " ", 1);
  fiobj_str_join(l, h->path);
  fiobj_str_write(l, " ", 1);
  fiobj_str_join(l, h->version);
  fiobj_str_write(l, "\" ", 2);
  if (bytes_sent > 0) {
    fiobj_str_write_i(l, h->status);
    fiobj_str_write(l, " ", 1);
    fiobj_str_write_i(l, bytes_sent);
    fiobj_str_write(l, "b ", 2);
  } else {
    fiobj_str_join(l, fiobj_num_tmp(h->status));
    fiobj_str_write(l, " -- ", 4);
  }

  bytes_sent = ((end.tv_sec - start.tv_sec) * 1000) +
               ((end.tv_nsec - start.tv_nsec) / 1000000);
  fiobj_str_write_i(l, bytes_sent);
  fiobj_str_write(l, "ms\r\n", 4);

  buff = fiobj_obj2cstr(l);
  fwrite(buff.data, 1, buff.len, stderr);
  fiobj_free(l);
}